

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O2

void __thiscall
Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::RecycleDynamicBufferId
          (RenderDeviceBase<Diligent::EngineVkImplTraits> *this,Uint32 Id)

{
  char (*in_R8) [54];
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar1;
  string msg;
  Uint32 local_3c;
  string local_38;
  
  local_3c = Id;
  Threading::SpinLock::lock(&this->m_RecycledDynamicBufferIdsLock);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->m_RecycledDynamicBufferIds,&local_3c);
  pVar1 = std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::_M_emplace<unsigned_int&>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&this->m_DbgRecycledDynamicBufferIds,&local_3c);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    FormatString<char[19],unsigned_int,char[54]>
              (&local_38,(Diligent *)"Dynamic buffer ID ",(char (*) [19])&local_3c,
               (uint *)" has already been recycled. This appears to be a bug.",in_R8);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"RecycleDynamicBufferId",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0x180);
    std::__cxx11::string::~string((string *)&local_38);
  }
  Threading::SpinLock::unlock(&this->m_RecycledDynamicBufferIdsLock);
  return;
}

Assistant:

void RecycleDynamicBufferId(Uint32 Id)
    {
        Threading::SpinLockGuard Guard{m_RecycledDynamicBufferIdsLock};
        m_RecycledDynamicBufferIds.push_back(Id);
#ifdef DILIGENT_DEBUG
        VERIFY(m_DbgRecycledDynamicBufferIds.emplace(Id).second, "Dynamic buffer ID ", Id, " has already been recycled. This appears to be a bug.");
#endif
    }